

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodeltester.cpp
# Opt level: O0

void __thiscall
QAbstractItemModelTesterPrivate::columnsInserted
          (QAbstractItemModelTesterPrivate *this,QModelIndex *parent,int first,int last)

{
  bool bVar1;
  QDebug *o;
  QAbstractItemModel *pQVar2;
  undefined8 in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  int unaff_retaddr;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 uVar3;
  int in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  QString *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  QDebug *in_stack_fffffffffffffef8;
  char *t;
  char *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  ChangeInFlight *in_stack_ffffffffffffff80;
  ChangeInFlight *in_stack_ffffffffffffff88;
  QAbstractItemModelTesterPrivate *in_stack_ffffffffffffff90;
  QDebug local_58;
  QDebug local_50;
  QDebug local_48;
  undefined4 local_3c;
  undefined1 *local_38;
  undefined1 *local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 1;
  uVar3 = 0x2e7;
  bVar1 = compare<QAbstractItemModelTesterPrivate::ChangeInFlight,QAbstractItemModelTesterPrivate::ChangeInFlight>
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                     in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_RDI,unaff_retaddr);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    in_RDI[0xc4] = '\0';
    in_RDI[0xc5] = '\0';
    in_RDI[0xc6] = '\0';
    in_RDI[199] = '\0';
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    lcModelTest();
    anon_unknown.dwarf_21e2d9::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffecc,uVar3));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_38), bVar1) {
      anon_unknown.dwarf_21e2d9::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x18dcce);
      t = &stack0xffffffffffffff88;
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                 (char *)CONCAT44(in_stack_fffffffffffffecc,uVar3),(char *)0x18dcea);
      QMessageLogger::debug();
      QDebug::operator<<(in_stack_fffffffffffffef8,t);
      QDebug::operator<<(in_stack_fffffffffffffef8,t);
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         in_stack_fffffffffffffecc);
      QDebug::operator<<(in_stack_fffffffffffffef8,t);
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         in_stack_fffffffffffffecc);
      o = QDebug::operator<<(in_stack_fffffffffffffef8,t);
      QDebug::QDebug(&local_50,o);
      ::operator<<((Stream *)&local_48,(QModelIndex *)&local_50);
      in_stack_fffffffffffffef8 = QDebug::operator<<(in_stack_fffffffffffffef8,t);
      pQVar2 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x18dded);
      (**(code **)(*(long *)pQVar2 + 0x90))(&local_28,pQVar2,in_RSI,0);
      QVariant::toString();
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         in_stack_fffffffffffffed8);
      QDebug::operator<<(in_stack_fffffffffffffef8,t);
      pQVar2 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x18de66);
      in_stack_fffffffffffffee4 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,in_RSI);
      QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         in_stack_fffffffffffffecc);
      QString::~QString((QString *)0x18de9d);
      QVariant::~QVariant(&local_28);
      QDebug::~QDebug(&local_48);
      QDebug::~QDebug(&local_50);
      QDebug::~QDebug(&local_58);
      local_30 = (undefined1 *)((ulong)local_30 & 0xffffffffffffff00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemModelTesterPrivate::columnsInserted(const QModelIndex &parent, int first,
                                                      int last)
{
    MODELTESTER_COMPARE(changeInFlight, ChangeInFlight::ColumnsInserted);
    changeInFlight = ChangeInFlight::None;

    qCDebug(lcModelTest) << "columnsInserted"
                         << "start=" << first << "end=" << last << "parent=" << parent
                         << "parent data=" << model->data(parent).toString()
                         << "current count of parent=" << model->rowCount(parent);
}